

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_3d785c::ArgParser::argPositional(ArgParser *this,string *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->gave_input == false) {
    QPDFJob::Config::inputFile
              ((this->c_main).super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,arg);
    this->gave_input = true;
  }
  else if (this->gave_output == false) {
    QPDFJob::Config::outputFile
              ((this->c_main).super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,arg);
    this->gave_output = true;
  }
  else {
    std::operator+(&local_30,"unknown argument ",arg);
    QPDFArgParser::usage(&this->ap,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void
ArgParser::argPositional(std::string const& arg)
{
    if (!this->gave_input) {
        c_main->inputFile(arg);
        this->gave_input = true;
    } else if (!this->gave_output) {
        c_main->outputFile(arg);
        this->gave_output = true;
    } else {
        usage("unknown argument " + arg);
    }
}